

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *p)

{
  int iVar1;
  Bmc_EsPar_t *pBVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int (*plits) [64];
  bmcg_sat_solver *s;
  long lVar17;
  int iVar18;
  int (*paiVar19) [32];
  bool bVar20;
  int Node [2];
  int Entry [2];
  int local_50 [2];
  int (*local_48) [64];
  int local_40 [2];
  int (*local_38) [32];
  
  iVar13 = p->pPars->nVars;
  iVar18 = 0;
  if (iVar13 < p->nObjs) {
    iVar18 = 0;
    do {
      iVar3 = Zyx_ManCollectFanins(p,iVar13);
      iVar10 = p->pPars->nLutSize;
      bVar20 = false;
      if (iVar3 != iVar10) {
        if (iVar3 != p->nLits[1]) {
          __assert_fail("nFanins == p->nLits[1]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                        ,0x364,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
        }
        iVar18 = iVar18 + 1;
        if (iVar10 < p->nLits[1]) {
          iVar10 = iVar10 + 1;
          p->nLits[1] = iVar10;
          s = p->pSat;
          plits = p->pLits + 1;
        }
        else {
          s = p->pSat;
          iVar10 = p->nLits[0];
          plits = p->pLits;
        }
        iVar10 = bmcg_sat_solver_addclause(s,*plits,iVar10);
        if (iVar10 == 0) {
          bVar20 = true;
        }
        else {
          bVar20 = false;
        }
      }
      if (bVar20) {
        return -1;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < p->nObjs);
  }
  if ((iVar18 == 0) && (p->pPars->fOrderNodes != 0)) {
    iVar13 = p->pPars->nVars;
    lVar14 = (long)iVar13;
    uVar9 = (ulong)(uint)p->nObjs;
    iVar18 = 0;
    if (iVar13 + 1 < p->nObjs) {
      paiVar19 = p->pFanins;
      local_48 = p->pLits;
      lVar17 = lVar14 + 1;
      iVar18 = 0;
      local_38 = paiVar19;
      do {
        pBVar2 = p->pPars;
        uVar6 = pBVar2->nLutSize;
        uVar15 = (int)uVar6 >> 0x1f & uVar6;
        uVar7 = uVar6;
        do {
          uVar6 = uVar6 - 1;
          uVar16 = uVar15;
          uVar4 = uVar15 - 1;
          if ((int)uVar7 < 1) break;
          uVar4 = uVar7 - 1;
          uVar16 = uVar7;
          uVar7 = uVar4;
        } while (paiVar19[lVar14][uVar6] == paiVar19[lVar17][uVar6]);
        iVar13 = (int)lVar17;
        iVar10 = (int)lVar14;
        if (uVar16 == 0) {
          if (pBVar2->fMajority == 0) {
            iVar3 = p->LutMask;
            if (-1 < iVar3) {
              do {
                iVar5 = bmcg_sat_solver_read_cex_varvalue
                                  (p->pSat,(iVar10 - p->pPars->nVars) * (p->LutMask + 1) + iVar3);
                iVar12 = bmcg_sat_solver_read_cex_varvalue
                                   (p->pSat,(iVar13 - p->pPars->nVars) * (p->LutMask + 1) + iVar3);
                if (iVar5 != iVar12) goto LAB_005ac1e7;
                bVar20 = 0 < iVar3;
                iVar3 = iVar3 + -1;
              } while (bVar20);
              iVar3 = -1;
            }
LAB_005ac1e7:
            if ((iVar3 != -1) &&
               ((iVar5 = bmcg_sat_solver_read_cex_varvalue
                                   (p->pSat,(iVar10 - p->pPars->nVars) * (p->LutMask + 1) + iVar3),
                iVar5 != 0 ||
                (iVar5 = bmcg_sat_solver_read_cex_varvalue
                                   (p->pSat,(iVar13 - p->pPars->nVars) * (p->LutMask + 1) + iVar3),
                iVar5 != 1)))) {
              iVar5 = bmcg_sat_solver_read_cex_varvalue
                                (p->pSat,(iVar10 - p->pPars->nVars) * (p->LutMask + 1) + iVar3);
              if (iVar5 != 1) {
                __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) == 1"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                              ,0x38d,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
              }
              iVar5 = bmcg_sat_solver_read_cex_varvalue
                                (p->pSat,(iVar13 - p->pPars->nVars) * (p->LutMask + 1) + iVar3);
              if (iVar5 != 0) {
                __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i , k)) == 0"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                              ,0x38e,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
              }
              p->nLits[0] = 0;
              iVar5 = p->LutMask;
              if (iVar3 <= iVar5) {
                iVar12 = iVar5 * 2;
                do {
                  uVar6 = bmcg_sat_solver_read_cex_varvalue
                                    (p->pSat,(iVar10 - p->pPars->nVars) * (p->LutMask + 1) + iVar5);
                  uVar7 = bmcg_sat_solver_read_cex_varvalue
                                    (p->pSat,(iVar13 - p->pPars->nVars) * (p->LutMask + 1) + iVar5);
                  if (1 < uVar6) goto LAB_005ac644;
                  pBVar2 = p->pPars;
                  iVar11 = (iVar10 - pBVar2->nVars) * (p->LutMask + 1);
                  if (iVar5 + iVar11 < 0) goto LAB_005ac644;
                  iVar1 = p->nLits[0];
                  p->nLits[0] = iVar1 + 1;
                  p->pLits[0][iVar1] = uVar6 + iVar11 * 2 + iVar12;
                  if ((1 < uVar7) ||
                     (iVar11 = (iVar13 - pBVar2->nVars) * (p->LutMask + 1), iVar5 + iVar11 < 0))
                  goto LAB_005ac644;
                  iVar1 = p->nLits[0];
                  p->nLits[0] = iVar1 + 1;
                  p->pLits[0][iVar1] = uVar7 + iVar11 * 2 + iVar12;
                  iVar12 = iVar12 + -2;
                  bVar20 = iVar3 < iVar5;
                  iVar5 = iVar5 + -1;
                } while (bVar20);
              }
              iVar13 = bmcg_sat_solver_addclause(p->pSat,*local_48,p->nLits[0]);
              paiVar19 = local_38;
              if (iVar13 == 0) {
                return -1;
              }
              goto LAB_005ac1c6;
            }
          }
        }
        else if (paiVar19[lVar14][(int)uVar4] < paiVar19[lVar17][(int)uVar4]) {
          iVar10 = bmcg_sat_solver_read_cex_varvalue
                             (p->pSat,paiVar19[lVar17][(int)uVar4] + p->TopoBase +
                                      (iVar10 - pBVar2->nVars) * (int)uVar9);
          if (iVar10 != 0) {
            __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i][k])) == 0"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x39e,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
          iVar13 = bmcg_sat_solver_read_cex_varvalue
                             (p->pSat,p->TopoBase + paiVar19[lVar17][(int)uVar4] +
                                      (iVar13 - p->pPars->nVars) * p->nObjs);
          if (iVar13 != 1) {
            __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i , p->pFanins[i][k])) == 1"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x39f,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
        }
        else {
          iVar3 = bmcg_sat_solver_read_cex_varvalue
                            (p->pSat,paiVar19[lVar14][(int)uVar4] + p->TopoBase +
                                     (iVar10 - pBVar2->nVars) * (int)uVar9);
          if (iVar3 != 1) {
            __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i-1][k])) == 1"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x3a3,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
          iVar3 = bmcg_sat_solver_read_cex_varvalue
                            (p->pSat,p->TopoBase + paiVar19[lVar14][(int)uVar4] +
                                     (iVar13 - p->pPars->nVars) * p->nObjs);
          if (iVar3 != 0) {
            __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i , p->pFanins[i-1][k])) == 0"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x3a4,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
          p->nLits[0] = 0;
          iVar3 = paiVar19[lVar14][(int)uVar4];
          iVar5 = p->nObjs;
          if (iVar3 < iVar5 + -1) {
            do {
              uVar6 = bmcg_sat_solver_read_cex_varvalue
                                (p->pSat,(iVar10 - p->pPars->nVars) * iVar5 + p->TopoBase + iVar3);
              uVar7 = bmcg_sat_solver_read_cex_varvalue
                                (p->pSat,(iVar13 - p->pPars->nVars) * p->nObjs + p->TopoBase + iVar3
                                );
              if (1 < uVar6) goto LAB_005ac644;
              pBVar2 = p->pPars;
              iVar5 = (iVar10 - pBVar2->nVars) * p->nObjs + p->TopoBase + iVar3;
              if (iVar5 < 0) goto LAB_005ac644;
              iVar12 = p->nLits[0];
              p->nLits[0] = iVar12 + 1;
              p->pLits[0][iVar12] = uVar6 + iVar5 * 2;
              if ((1 < uVar7) ||
                 (iVar5 = (iVar13 - pBVar2->nVars) * p->nObjs + p->TopoBase + iVar3, iVar5 < 0))
              goto LAB_005ac644;
              iVar12 = p->nLits[0];
              p->nLits[0] = iVar12 + 1;
              p->pLits[0][iVar12] = uVar7 + iVar5 * 2;
              iVar3 = iVar3 + 1;
              iVar5 = p->nObjs;
            } while (iVar3 < iVar5 + -1);
          }
          iVar13 = bmcg_sat_solver_addclause(p->pSat,*local_48,p->nLits[0]);
          if (iVar13 == 0) {
            return -1;
          }
LAB_005ac1c6:
          iVar18 = iVar18 + 1;
        }
        lVar17 = lVar17 + 1;
        uVar9 = (ulong)p->nObjs;
        lVar14 = lVar14 + 1;
      } while (lVar17 < (long)uVar9);
    }
    pVVar8 = p->vPairs;
    if (1 < pVVar8->nSize) {
      lVar14 = 0;
      do {
        iVar13 = pVVar8->pArray[lVar14];
        local_40[0] = iVar13;
        iVar10 = pVVar8->pArray[lVar14 + 1];
        local_40[1] = iVar10;
        if (iVar10 <= iVar13) {
          __assert_fail("Entry[0] < Entry[1]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                        ,0x3b8,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
        }
        lVar17 = 0;
        do {
          local_50[lVar17] = -1;
          iVar3 = p->pPars->nVars;
          iVar5 = p->nObjs;
          if (iVar3 < iVar5) {
            iVar12 = local_40[lVar17];
            do {
              iVar5 = bmcg_sat_solver_read_cex_varvalue
                                (p->pSat,p->TopoBase + iVar12 + (iVar3 - p->pPars->nVars) * iVar5);
              if (iVar5 != 0) {
                local_50[lVar17] = iVar3;
                break;
              }
              iVar3 = iVar3 + 1;
              iVar5 = p->nObjs;
            } while (iVar3 < iVar5);
          }
          iVar3 = local_50[1];
          if (local_50[lVar17] < p->pPars->nVars) {
            __assert_fail("Node[j] >= p->pPars->nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x3c2,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
          bVar20 = lVar17 == 0;
          lVar17 = lVar17 + 1;
        } while (bVar20);
        if (local_50[1] < local_50[0]) {
          iVar5 = bmcg_sat_solver_read_cex_varvalue
                            (p->pSat,p->TopoBase + iVar13 +
                                     (local_50[1] - p->pPars->nVars) * p->nObjs);
          if (iVar5 != 0) {
            __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[0])) == 0"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x3ca,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
          iVar5 = bmcg_sat_solver_read_cex_varvalue
                            (p->pSat,p->TopoBase + iVar10 + (iVar3 - p->pPars->nVars) * p->nObjs);
          if (iVar5 != 1) {
            __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[1])) == 1"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x3cb,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
          p->nLits[0] = 0;
          iVar5 = p->pPars->nVars;
          if (iVar5 <= iVar3) {
            do {
              uVar6 = bmcg_sat_solver_read_cex_varvalue
                                (p->pSat,p->TopoBase + iVar13 + (iVar5 - p->pPars->nVars) * p->nObjs
                                );
              uVar7 = bmcg_sat_solver_read_cex_varvalue
                                (p->pSat,p->TopoBase + iVar10 + (iVar5 - p->pPars->nVars) * p->nObjs
                                );
              if (1 < uVar6) {
LAB_005ac644:
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              pBVar2 = p->pPars;
              iVar12 = p->TopoBase + iVar13 + (iVar5 - pBVar2->nVars) * p->nObjs;
              if (iVar12 < 0) goto LAB_005ac644;
              iVar11 = p->nLits[0];
              p->nLits[0] = iVar11 + 1;
              p->pLits[0][iVar11] = uVar6 + iVar12 * 2;
              if ((1 < uVar7) ||
                 (iVar12 = p->TopoBase + iVar10 + (iVar5 - pBVar2->nVars) * p->nObjs, iVar12 < 0))
              goto LAB_005ac644;
              iVar11 = p->nLits[0];
              p->nLits[0] = iVar11 + 1;
              p->pLits[0][iVar11] = uVar7 + iVar12 * 2;
              iVar5 = iVar5 + 1;
            } while (iVar3 + 1 != iVar5);
          }
          iVar13 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],p->nLits[0]);
          if (iVar13 == 0) {
            return -1;
          }
          iVar18 = iVar18 + 1;
        }
        lVar14 = lVar14 + 2;
        pVVar8 = p->vPairs;
      } while ((int)((uint)lVar14 | 1) < pVVar8->nSize);
    }
  }
  return iVar18;
}

Assistant:

int Zyx_ManAddCnfLazyTopo( Zyx_Man_t * p )
{
    int i, k, j, Entry[2], Node[2], nLazy = 0;
    // fanin count
    //printf( "Adding topology clauses.\n" );
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        int nFanins = Zyx_ManCollectFanins( p, i );
        if ( nFanins == p->pPars->nLutSize )
            continue;
        nLazy++;
        assert( nFanins == p->nLits[1] );
        if ( p->nLits[1] > p->pPars->nLutSize )
        {
            p->nLits[1] = p->pPars->nLutSize + 1;
            //Zyx_PrintClause( p->pLits[1], p->nLits[1] );
            if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[1], p->nLits[1] ) )
                return -1;
        }
        else // if ( p->nLits[1] < p->pPars->nLutSize )
        {
            //Zyx_PrintClause( p->pLits[0], p->nLits[0] );
            if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                return -1;
        }
    }
    if ( nLazy || !p->pPars->fOrderNodes )
        return nLazy;
    // ordering
    for ( i = p->pPars->nVars + 1; i < p->nObjs; i++ )
    {
        for ( k = p->pPars->nLutSize - 1; k >= 0; k-- )
            if ( p->pFanins[i-1][k] != p->pFanins[i][k] )
                break;
        if ( k == -1 ) // fanins are equal
        {
            if ( p->pPars->fMajority )
                continue;
            // compare by LUT functions
            for ( k = p->LutMask; k >= 0; k-- )
                if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) != 
                     bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i  , k)) )
                    break;
            if ( k == -1 ) // truth tables cannot be equal
                continue;
            // rule out these truth tables
            if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) == 0 && 
                 bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i  , k)) == 1 )
            {
                continue;
            }
            nLazy++;
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) == 1 );
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i  , k)) == 0 );
            // rule out this order
            p->nLits[0] = 0;
            for ( j = p->LutMask; j >= k; j-- )
            {
                int ValA = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, j));
                int ValB = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i,   j));
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_FuncVar(p, i-1, j), ValA );
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_FuncVar(p, i,   j), ValB );
            }
            if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                return -1;
            continue;
        }
        if ( p->pFanins[i-1][k] < p->pFanins[i][k] )
        {
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i][k])) == 0 );
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i  , p->pFanins[i][k])) == 1 );
            continue;
        }
        nLazy++;
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i-1][k])) == 1 );
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i  , p->pFanins[i-1][k])) == 0 );
        // rule out this order
        p->nLits[0] = 0;
        for ( j = p->pFanins[i-1][k]; j < p->nObjs-1; j++ )
        {
            int ValA = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, j));
            int ValB = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i,   j));
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, i-1, j), ValA );
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, i,   j), ValB );
        }
        //printf( "\n" );
        //Zyx_ManPrintVarMap( p, 1 );
        //Zyx_PrintClause( p->pLits[0], p->nLits[0] );
        if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
            return -1;
        //break;
    }
    // check symmetric variables
    Vec_IntForEachEntryDouble( p->vPairs, Entry[0], Entry[1], k )
    {
        assert( Entry[0] < Entry[1] );
        for ( j = 0; j < 2; j++ )
        {
            Node[j] = -1;
            for ( i = p->pPars->nVars; i < p->nObjs; i++ )
                if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i, Entry[j])) )
                {
                    Node[j] = i;
                    break;
                }
            assert( Node[j] >= p->pPars->nVars );
        }
        // compare the nodes
        if ( Node[0] <= Node[1] )
            continue;
        assert( Node[0] > Node[1] );
        // create blocking clause
        nLazy++;
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[0])) == 0 );
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[1])) == 1 );
        // rule out this order
        p->nLits[0] = 0;
        for ( j = p->pPars->nVars; j <= Node[1]; j++ )
        {
            int ValA = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, j, Entry[0]));
            int ValB = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, j, Entry[1]));
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, j, Entry[0]), ValA );
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, j, Entry[1]), ValB );
        }
        if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
            return -1;
    }
    return nLazy;
}